

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReplacementVisitor.hpp
# Opt level: O0

void __thiscall OpenMD::GBheadVisitor::GBheadVisitor(GBheadVisitor *this,SimInfo *info)

{
  undefined8 *in_RDI;
  double in_stack_fffffffffffffec8;
  double in_stack_fffffffffffffed0;
  undefined1 *y;
  string *in_stack_fffffffffffffed8;
  allocator<char> *x;
  ReplacementVisitor *in_stack_fffffffffffffee0;
  Vector3<double> *this_00;
  SimInfo *in_stack_fffffffffffffef8;
  ReplacementVisitor *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  string local_e8 [8];
  Vector3d *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  ReplacementVisitor *in_stack_ffffffffffffff30;
  allocator<char> local_a9;
  string local_a8 [63];
  undefined1 local_69 [40];
  allocator<char> local_41;
  string local_40 [64];
  
  ReplacementVisitor::ReplacementVisitor(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  *in_RDI = &PTR__GBheadVisitor_00481288;
  std::__cxx11::string::operator=((string *)(in_RDI + 1),"GBheadVisitor");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             (allocator<char> *)in_stack_ffffffffffffff00);
  ReplacementVisitor::addReplacedAtomName(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  this_00 = (Vector3<double> *)local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             (allocator<char> *)in_stack_ffffffffffffff00);
  Vector3<double>::Vector3
            (this_00,(double)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
             in_stack_fffffffffffffec8);
  ReplacementVisitor::addSite
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::__cxx11::string::~string((string *)(local_69 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_69);
  x = &local_a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             (allocator<char> *)in_stack_ffffffffffffff00);
  Vector3<double>::Vector3(this_00,(double)x,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  ReplacementVisitor::addSite
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator(&local_a9);
  y = &stack0xffffffffffffff17;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             (allocator<char> *)in_stack_ffffffffffffff00);
  Vector3<double>::Vector3(this_00,(double)x,(double)y,in_stack_fffffffffffffec8);
  ReplacementVisitor::addSite
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff17);
  return;
}

Assistant:

GBheadVisitor(SimInfo* info) : ReplacementVisitor(info) {
      visitorName = "GBheadVisitor";

      /// these are the atom names we can replace with a fixed structure
      addReplacedAtomName("GBhead");

      // this is the reference structure we'll use for the replacement:
      addSite("N", Vector3d(0.0, 0.0, 3.5));
      addSite("C", Vector3d(0.0, 0.0, 0.0));
      addSite("P", Vector3d(0.0, 0.0, -3.5));
    }